

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O1

Status __thiscall
google::protobuf::(anonymous_namespace)::Error<char_const*>(_anonymous_namespace_ *this,char *args)

{
  size_t sVar1;
  string_view message;
  long *local_40;
  char *local_38;
  long local_30 [2];
  
  if (args == (char *)0x0) {
    sVar1 = 0;
    args = (char *)0x0;
  }
  else {
    sVar1 = strlen(args);
  }
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,args,args + sVar1);
  message._M_str = local_38;
  message._M_len = (size_t)this;
  absl::lts_20250127::FailedPreconditionError(message);
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status Error(Args... args) {
  return absl::FailedPreconditionError(absl::StrCat(args...));
}